

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::Touch(string *filename,bool create)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *__path;
  FILE *file;
  bool create_local;
  string *filename_local;
  
  bVar1 = PathExists(filename);
  if (bVar1) {
    __path = (char *)std::__cxx11::string::c_str();
    iVar2 = utimensat(-100,__path,(timespec *)0x0,0);
    if (iVar2 < 0) {
      filename_local._7_1_ = false;
    }
    else {
      filename_local._7_1_ = true;
    }
  }
  else if (create) {
    __stream = (FILE *)Fopen(filename,"a+b");
    if (__stream == (FILE *)0x0) {
      filename_local._7_1_ = false;
    }
    else {
      fclose(__stream);
      filename_local._7_1_ = true;
    }
  }
  else {
    filename_local._7_1_ = true;
  }
  return filename_local._7_1_;
}

Assistant:

bool SystemTools::Touch(const std::string& filename, bool create)
{
  if (!SystemTools::PathExists(filename)) {
    if (create) {
      FILE* file = Fopen(filename, "a+b");
      if (file) {
        fclose(file);
        return true;
      }
      return false;
    } else {
      return true;
    }
  }
#if defined(_WIN32) && !defined(__CYGWIN__)
  HANDLE h = CreateFileW(Encoding::ToWindowsExtendedPath(filename).c_str(),
                         FILE_WRITE_ATTRIBUTES, FILE_SHARE_WRITE, 0,
                         OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!h) {
    return false;
  }
  FILETIME mtime;
  GetSystemTimeAsFileTime(&mtime);
  if (!SetFileTime(h, 0, 0, &mtime)) {
    CloseHandle(h);
    return false;
  }
  CloseHandle(h);
#elif KWSYS_CXX_HAS_UTIMENSAT
  // utimensat is only available on newer Unixes and macOS 10.13+
  if (utimensat(AT_FDCWD, filename.c_str(), NULL, 0) < 0) {
    return false;
  }
#else
  // fall back to utimes
  if (utimes(filename.c_str(), NULL) < 0) {
    return false;
  }
#endif
  return true;
}